

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

qsizetype QtPrivate::lastIndexOf
                    (QStringView haystack,qsizetype from,QLatin1StringView needle,CaseSensitivity cs
                    )

{
  long lVar1;
  qsizetype qVar2;
  long in_FS_OFFSET;
  CaseSensitivity in_stack_00000094;
  qsizetype in_stack_00000098;
  undefined1 in_stack_00000100 [16];
  undefined1 in_stack_00000110 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  qVar2 = (anonymous_namespace)::qLastIndexOf<QStringView,QLatin1String>
                    ((QStringView)in_stack_00000110,in_stack_00000098,
                     (QLatin1String)in_stack_00000100,in_stack_00000094);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return qVar2;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype QtPrivate::lastIndexOf(QStringView haystack, qsizetype from, QLatin1StringView needle, Qt::CaseSensitivity cs) noexcept
{
    return qLastIndexOf(haystack, from, needle, cs);
}